

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy.h
# Opt level: O2

int64_t __thiscall
disruptor::BlockingStrategy::WaitFor<long,std::ratio<1l,1000000l>>
          (BlockingStrategy *this,int64_t *sequence,Sequence *cursor,
          vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *dependents,
          atomic<bool> *alerted,duration<long,_std::ratio<1L,_1000000L>_> *timeout)

{
  int64_t iVar1;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = timeout->__r;
  local_10 = std::
             _Function_handler<bool_(std::unique_lock<std::mutex>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:327:20)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(std::unique_lock<std::mutex>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:327:20)>
             ::_M_manager;
  local_28._M_unused._M_object = this;
  iVar1 = WaitFor(this,sequence,cursor,dependents,alerted,(Waiter *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return iVar1;
}

Assistant:

int64_t WaitFor(const int64_t& sequence, const Sequence& cursor,
                  const std::vector<Sequence*>& dependents,
                  const std::atomic<bool>& alerted,
                  const std::chrono::duration<Rep, Period>& timeout) {
    return WaitFor(sequence, cursor, dependents, alerted,
                   [this, timeout](Lock& lock) {
                     return std::cv_status::timeout ==
                            consumer_notify_condition_.wait_for(
                                lock, std::chrono::microseconds(timeout));
                   });
  }